

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<unsigned_int>
          (options_serializer_boost_po *this,base_option *base_option)

{
  options_serializer_boost_po *poVar1;
  typed_option<unsigned_int> *this_00;
  long in_RSI;
  typed_option<unsigned_int> *in_RDI;
  typed_option<unsigned_int> typed;
  typed_option<unsigned_int> *ptVar2;
  options_serializer_boost_po *this_01;
  typed_option<unsigned_int> local_b8;
  long local_18;
  byte local_1;
  
  this_01 = *(options_serializer_boost_po **)(in_RSI + 0x28);
  local_18 = in_RSI;
  poVar1 = (options_serializer_boost_po *)std::type_info::hash_code((type_info *)this_01);
  if (this_01 == poVar1) {
    this_00 = (typed_option<unsigned_int> *)
              __dynamic_cast(local_18,&config::base_option::typeinfo,
                             &typed_option<unsigned_int>::typeinfo,0);
    if (this_00 == (typed_option<unsigned_int> *)0x0) {
      __cxa_bad_cast();
    }
    ptVar2 = &local_b8;
    typed_option<unsigned_int>::typed_option(this_00,ptVar2);
    typed_option<unsigned_int>::typed_option(this_00,ptVar2);
    serialize<unsigned_int>(this_01,in_RDI);
    typed_option<unsigned_int>::~typed_option(this_00);
    local_1 = 1;
    typed_option<unsigned_int>::~typed_option(this_00);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }